

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_ObjCoArrival2_rec(Lf_Man_t *p,Gia_Obj_t *pDriver)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pDriver_00;
  Lf_Bst_t *p_00;
  int Index;
  Lf_Bst_t *pBest;
  Gia_Obj_t *pDriver_local;
  Lf_Man_t *p_local;
  
  iVar1 = Gia_ObjIsBuf(pDriver);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAnd(pDriver);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pDriver);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = Gia_ObjCioId(pDriver);
        p_local._4_4_ = Lf_ObjCiArrival(p,iVar1);
      }
    }
    else {
      iVar1 = Gia_ObjId(p->pGia,pDriver);
      p_00 = Lf_ObjReadBest(p,iVar1);
      iVar1 = Lf_BestCutIndex(p_00);
      if (1 < iVar1) {
        iVar2 = Gia_ObjIsMux(p->pGia,pDriver);
        if (iVar2 == 0) {
          __assert_fail("Index < 2 || Gia_ObjIsMux(p->pGia, pDriver)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                        ,0xbf,"int Lf_ObjCoArrival2_rec(Lf_Man_t *, Gia_Obj_t *)");
        }
      }
      p_local._4_4_ = p_00->Delay[iVar1];
    }
  }
  else {
    pDriver_00 = Gia_ObjFanin0(pDriver);
    p_local._4_4_ = Lf_ObjCoArrival2_rec(p,pDriver_00);
  }
  return p_local._4_4_;
}

Assistant:

int Lf_ObjCoArrival2_rec( Lf_Man_t * p, Gia_Obj_t * pDriver )
{
    if ( Gia_ObjIsBuf(pDriver) )
        return Lf_ObjCoArrival2_rec( p, Gia_ObjFanin0(pDriver) );
    if ( Gia_ObjIsAnd(pDriver) )
    {
        Lf_Bst_t * pBest = Lf_ObjReadBest(p, Gia_ObjId(p->pGia, pDriver));
        int Index = Lf_BestCutIndex( pBest );
        assert( Index < 2 || Gia_ObjIsMux(p->pGia, pDriver) );
        return pBest->Delay[Index];
    }
    if ( Gia_ObjIsCi(pDriver) )
        return Lf_ObjCiArrival(p, Gia_ObjCioId(pDriver));
    return 0;
}